

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getmemberhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  bool bVar1;
  SQObjectPtr *key;
  SQRESULT SVar2;
  SQObjectPtr val;
  SQObjectPtr *o;
  
  o = (SQObjectPtr *)0x0;
  bVar1 = sq_aux_gettypedarg(v,idx,OT_CLASS,&o);
  SVar2 = -1;
  if (bVar1) {
    key = SQVM::GetUp(v,-1);
    val.super_SQObject._unVal.pTable = (SQTable *)0x0;
    val.super_SQObject._type = OT_NULL;
    val.super_SQObject._flags = '\0';
    val.super_SQObject._5_3_ = 0;
    bVar1 = SQTable::Get(((o->super_SQObject)._unVal.pDelegable)->_delegate,key,&val);
    if (bVar1) {
      handle->_static = (ulong)((val.super_SQObject._unVal._0_4_ >> 0x16 & 1) == 0);
      handle->_index = (ulong)(val.super_SQObject._unVal._0_4_ & 0x3fffff);
      SQVM::Pop(v);
      SVar2 = 0;
    }
    else {
      sq_throwerror(v,"wrong index");
    }
    SQObjectPtr::~SQObjectPtr(&val);
  }
  return SVar2;
}

Assistant:

SQRESULT sq_getmemberhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-1);
    SQTable *m = _class(*o)->_members;
    SQObjectPtr val;
    if(m->Get(key,val)) {
        handle->_static = _isfield(val) ? SQFalse : SQTrue;
        handle->_index = _member_idx(val);
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}